

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O3

Cnf_Dat_t * Cnf_DataAlloc(Aig_Man_t *pAig,int nVars,int nClauses,int nLiterals)

{
  int iVar1;
  undefined1 auVar2 [16];
  Cnf_Dat_t *pCVar3;
  int **ppiVar4;
  int *piVar5;
  long lVar6;
  int iVar8;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  long lVar10;
  
  pCVar3 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar3->pMan = pAig;
  pCVar3->nVars = nVars;
  pCVar3->nClauses = nClauses;
  pCVar3->nLiterals = nLiterals;
  ppiVar4 = (int **)malloc((long)nClauses * 8 + 8);
  pCVar3->pClauses = ppiVar4;
  piVar5 = (int *)malloc((long)nLiterals * 4);
  *ppiVar4 = piVar5;
  ppiVar4[nClauses] = piVar5 + nLiterals;
  iVar1 = pAig->vObjs->nSize;
  lVar6 = (long)iVar1;
  piVar5 = (int *)malloc(lVar6 * 4);
  pCVar3->pVarNums = piVar5;
  auVar2 = _DAT_0093d220;
  if (0 < lVar6) {
    lVar6 = lVar6 + -1;
    auVar7._8_4_ = (int)lVar6;
    auVar7._0_8_ = lVar6;
    auVar7._12_4_ = (int)((ulong)lVar6 >> 0x20);
    lVar6 = 0;
    auVar7 = auVar7 ^ _DAT_0093d220;
    auVar9 = _DAT_0093e4e0;
    auVar11 = _DAT_0093d210;
    do {
      auVar12 = auVar11 ^ auVar2;
      iVar8 = auVar7._4_4_;
      if ((bool)(~(auVar12._4_4_ == iVar8 && auVar7._0_4_ < auVar12._0_4_ || iVar8 < auVar12._4_4_)
                & 1)) {
        *(undefined4 *)((long)piVar5 + lVar6) = 0xffffffff;
      }
      if ((auVar12._12_4_ != auVar7._12_4_ || auVar12._8_4_ <= auVar7._8_4_) &&
          auVar12._12_4_ <= auVar7._12_4_) {
        *(undefined4 *)((long)piVar5 + lVar6 + 4) = 0xffffffff;
      }
      auVar12 = auVar9 ^ auVar2;
      iVar13 = auVar12._4_4_;
      if (iVar13 <= iVar8 && (iVar13 != iVar8 || auVar12._0_4_ <= auVar7._0_4_)) {
        *(undefined4 *)((long)piVar5 + lVar6 + 8) = 0xffffffff;
        *(undefined4 *)((long)piVar5 + lVar6 + 0xc) = 0xffffffff;
      }
      lVar10 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar10 + 4;
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar10 + 4;
      lVar6 = lVar6 + 0x10;
    } while ((ulong)(iVar1 + 3U >> 2) << 4 != lVar6);
  }
  return pCVar3;
}

Assistant:

Cnf_Dat_t * Cnf_DataAlloc( Aig_Man_t * pAig, int nVars, int nClauses, int nLiterals )
{
    Cnf_Dat_t * pCnf;
    int i;
    pCnf = ABC_ALLOC( Cnf_Dat_t, 1 );
    memset( pCnf, 0, sizeof(Cnf_Dat_t) );
    pCnf->pMan = pAig;
    pCnf->nVars = nVars;
    pCnf->nClauses = nClauses;
    pCnf->nLiterals = nLiterals;
    pCnf->pClauses = ABC_ALLOC( int *, nClauses + 1 );
    pCnf->pClauses[0] = ABC_ALLOC( int, nLiterals );
    pCnf->pClauses[nClauses] = pCnf->pClauses[0] + nLiterals;
    pCnf->pVarNums = ABC_ALLOC( int, Aig_ManObjNumMax(pAig) );
//    memset( pCnf->pVarNums, 0xff, sizeof(int) * Aig_ManObjNumMax(pAig) );
    for ( i = 0; i < Aig_ManObjNumMax(pAig); i++ )
        pCnf->pVarNums[i] = -1;
    return pCnf;
}